

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2point_region.cc
# Opt level: O2

S2Cap * __thiscall S2PointRegion::GetCapBound(S2Cap *__return_storage_ptr__,S2PointRegion *this)

{
  S2Cap::FromPoint(__return_storage_ptr__,&this->point_);
  return __return_storage_ptr__;
}

Assistant:

S2Cap S2PointRegion::GetCapBound() const {
  return S2Cap::FromPoint(point_);
}